

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getkey.c
# Opt level: O1

int ffghsp(fitsfile *fptr,int *nexist,int *nmore,int *status)

{
  FITSfile *pFVar1;
  long lVar2;
  undefined1 auVar3 [16];
  int iVar4;
  
  if (0 < *status) {
    return *status;
  }
  if (fptr->HDUposition != fptr->Fptr->curhdu) {
    ffmahd(fptr,fptr->HDUposition + 1,(int *)0x0,status);
  }
  if (nexist != (int *)0x0) {
    pFVar1 = fptr->Fptr;
    auVar3 = SEXT816(pFVar1->headend - pFVar1->headstart[pFVar1->curhdu]) *
             SEXT816(0x6666666666666667);
    *nexist = (int)(auVar3._8_8_ >> 5) - (auVar3._12_4_ >> 0x1f);
  }
  lVar2 = fptr->Fptr->datastart;
  if (lVar2 == -1) {
    iVar4 = -1;
    if (nmore == (int *)0x0) goto LAB_00166987;
  }
  else {
    if (nmore == (int *)0x0) goto LAB_00166987;
    auVar3 = SEXT816(lVar2 - fptr->Fptr->headend) * SEXT816(0x6666666666666667);
    iVar4 = ((int)(auVar3._8_8_ >> 5) - (auVar3._12_4_ >> 0x1f)) + -1;
  }
  *nmore = iVar4;
LAB_00166987:
  return *status;
}

Assistant:

int ffghsp(fitsfile *fptr,  /* I - FITS file pointer                     */
           int *nexist,     /* O - number of existing keywords in header */
           int *nmore,      /* O - how many more keywords will fit       */
           int *status)     /* IO - error status                         */
/*
  returns the number of existing keywords (not counting the END keyword)
  and the number of more keyword that will fit in the current header 
  without having to insert more FITS blocks.
*/
{
    if (*status > 0)
        return(*status);

    if (fptr->HDUposition != (fptr->Fptr)->curhdu)
        ffmahd(fptr, (fptr->HDUposition) + 1, NULL, status);

    if (nexist)
        *nexist = (int) (( ((fptr->Fptr)->headend) - 
                ((fptr->Fptr)->headstart[(fptr->Fptr)->curhdu]) ) / 80);

    if ((fptr->Fptr)->datastart == DATA_UNDEFINED)
    {
      if (nmore)
        *nmore = -1;   /* data not written yet, so room for any keywords */
    }
    else
    {
      /* calculate space available between the data and the END card */
      if (nmore)
        *nmore = (int) (((fptr->Fptr)->datastart - (fptr->Fptr)->headend) / 80 - 1);
    }

    return(*status);
}